

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmn_live.c
# Opt level: O3

void cmn_live_update(cmn_t *cmn)

{
  int iVar1;
  int iVar2;
  mfcc_t *pmVar3;
  mfcc_t *pmVar4;
  long lVar5;
  char *pcVar6;
  long lVar7;
  
  if (cmn->nframe < 1) {
    return;
  }
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/feat/cmn_live.c"
          ,0x5f,"Update from < %s >\n",cmn->repr);
  iVar1 = cmn->nframe;
  iVar2 = cmn->veclen;
  lVar5 = (long)iVar2;
  if (lVar5 < 1) {
    if (iVar1 < 0x321) goto LAB_00125c47;
  }
  else {
    pmVar3 = cmn->cmn_mean;
    pmVar4 = cmn->sum;
    lVar7 = 0;
    do {
      pmVar3[lVar7] = (mfcc_t)((float)pmVar4[lVar7] / (float)iVar1);
      lVar7 = lVar7 + 1;
    } while (lVar5 != lVar7);
    if (iVar1 < 0x321) goto LAB_00125c47;
    if (0 < iVar2) {
      pmVar3 = cmn->sum;
      lVar7 = 0;
      do {
        pmVar3[lVar7] = (mfcc_t)((float)pmVar3[lVar7] * (1.0 / (float)iVar1) * 500.0);
        lVar7 = lVar7 + 1;
      } while (lVar5 != lVar7);
    }
  }
  cmn->nframe = 500;
LAB_00125c47:
  pcVar6 = cmn_update_repr(cmn);
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/feat/cmn_live.c"
          ,0x6c,"Update to   < %s >\n",pcVar6);
  return;
}

Assistant:

void
cmn_live_update(cmn_t *cmn)
{
    mfcc_t sf;
    int32 i;

    if (cmn->nframe <= 0)
        return;

    E_INFO("Update from < %s >\n", cmn->repr);
    /* Update mean buffer */
    sf = FLOAT2MFCC(1.0) / cmn->nframe;
    for (i = 0; i < cmn->veclen; i++)
        cmn->cmn_mean[i] = cmn->sum[i] / cmn->nframe; /* sum[i] * sf; */

    /* Make the accumulation decay exponentially */
    if (cmn->nframe > CMN_WIN_HWM) {
        sf = CMN_WIN * sf;
        for (i = 0; i < cmn->veclen; i++)
            cmn->sum[i] = MFCCMUL(cmn->sum[i], sf);
        cmn->nframe = CMN_WIN;
    }
    E_INFO("Update to   < %s >\n", cmn_update_repr(cmn));
}